

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void * c4::detail::arealloc_impl(void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  void *__dest;
  size_t __n;
  
  __dest = aalloc(newsz,alignment);
  __n = oldsz;
  if (newsz < oldsz) {
    __n = newsz;
  }
  if (__dest < (void *)(oldsz + (long)ptr) && ptr < (void *)(newsz + (long)__dest)) {
    memmove(__dest,ptr,__n);
  }
  else {
    memcpy(__dest,ptr,__n);
  }
  afree(ptr);
  return __dest;
}

Assistant:

void* arealloc_impl(void* ptr, size_t oldsz, size_t newsz, size_t alignment)
{
    /** @todo make this more efficient
     * @see https://stackoverflow.com/questions/9078259/does-realloc-keep-the-memory-alignment-of-posix-memalign
     * @see look for qReallocAligned() in http://code.qt.io/cgit/qt/qtbase.git/tree/src/corelib/global/qmalloc.cpp
     */
    void *tmp = aalloc(newsz, alignment);
    size_t min = newsz < oldsz ? newsz : oldsz;
    if(mem_overlaps(ptr, tmp, oldsz, newsz))
    {
        ::memmove(tmp, ptr, min);
    }
    else
    {
        ::memcpy(tmp, ptr, min);
    }
    afree(ptr);
    return tmp;
}